

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  streambuf *psVar4;
  undefined8 uVar5;
  bool _missingAssertions;
  uint uVar6;
  allocator local_512;
  allocator local_511;
  double local_510;
  string local_508;
  size_t local_4e8;
  size_t sStack_4e0;
  SectionInfo testCaseSection;
  StreamRedirect cerrRedir;
  SectionStats testCaseSectionStats;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&testCaseSection,_lineInfo,(string *)_name,&(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,&testCaseSection);
  local_4e8 = (this->m_totals).assertions.passed;
  sStack_4e0 = (this->m_totals).assertions.failed;
  sVar3 = (this->m_totals).assertions.failedButOk;
  std::__cxx11::string::string((string *)&cerrRedir,"TEST_CASE",&local_511);
  std::__cxx11::string::string((string *)&local_508,"",&local_512);
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)&testCaseSectionStats,(string *)&cerrRedir,_lineInfo,&local_508,Normal
            );
  AssertionInfo::operator=(&this->m_lastAssertionInfo,(AssertionInfo *)&testCaseSectionStats);
  AssertionInfo::~AssertionInfo((AssertionInfo *)&testCaseSectionStats);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&cerrRedir);
  seedRng((this->m_config).m_p);
  local_508._M_dataplus._M_p = (pointer)anon_unknown_23::getCurrentTicks();
  uVar6 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar6 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&testCaseSectionStats,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect(&cerrRedir,(ostream *)&std::cerr,redirectedCerr);
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect(&cerrRedir);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&testCaseSectionStats);
  }
  local_510 = Timer::getElapsedSeconds((Timer *)&local_508);
  (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[10])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  cerrRedir.m_stream = (ostream *)((this->m_totals).assertions.passed - local_4e8);
  cerrRedir.m_prevBuf = (streambuf *)((this->m_totals).assertions.failed - sStack_4e0);
  cerrRedir._16_8_ = (this->m_totals).assertions.failedButOk - sVar3;
  _missingAssertions = testForMissingAssertions(this,(Counts *)&cerrRedir);
  uVar5 = cerrRedir._16_8_;
  psVar4 = cerrRedir.m_prevBuf;
  if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
    cerrRedir._16_8_ = cerrRedir.m_prevBuf;
    cerrRedir.m_prevBuf = (streambuf *)uVar5;
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 - (long)psVar4;
    psVar1 = &(this->m_totals).assertions.failedButOk;
    *psVar1 = (size_t)(psVar4 + *psVar1);
  }
  SectionStats::SectionStats
            (&testCaseSectionStats,&testCaseSection,(Counts *)&cerrRedir,local_510,
             _missingAssertions);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&testCaseSectionStats);
  SectionStats::~SectionStats(&testCaseSectionStats);
  SectionInfo::~SectionInfo(&testCaseSection);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );

                seedRng( *m_config );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            m_testCaseTracker->close();
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }